

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

string * __thiscall Json::Value::asString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar5;
  char *__s;
  ostringstream oss;
  string sStack_1a8;
  ostringstream local_188 [376];
  size_t sVar4;
  
  bVar2 = (byte)*(ushort *)&this->field_0x8;
  if (5 < bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"Type is not convertible to string",0x21);
    std::__cxx11::stringbuf::str();
    throwLogicError(&sStack_1a8);
  }
  switch(bVar2) {
  case 1:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,0x1191bc);
    return __return_storage_ptr__;
  case 2:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,0x1191bc);
    return __return_storage_ptr__;
  case 3:
    (anonymous_namespace)::valueToString_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)0x0,(this->value_).real_,true,
               (&switchD_00108634::switchdataD_001191bc)[bVar2] + 0x1191bc);
    return __return_storage_ptr__;
  case 4:
    __s = (this->value_).string_;
    if ((uint *)__s != (uint *)0x0) {
      if ((*(ushort *)&this->field_0x8 >> 8 & 1) == 0) {
        sVar4 = strlen(__s);
        uVar3 = (uint)sVar4;
      }
      else {
        uVar3 = *(uint *)__s;
        __s = (char *)((long)__s + 4);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = (char *)((ulong)uVar3 + (long)__s);
      break;
    }
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "";
    __s = "";
    break;
  case 5:
    bVar1 = (this->value_).bool_;
    __s = "false";
    if ((ulong)bVar1 != 0) {
      __s = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = (char *)(((ulong)bVar1 ^ 5) + (long)__s);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar5);
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING Value::asString() const {
  switch (type_) {
  case nullValue:
    return "";
  case stringValue:
  {
    if (value_.string_ == 0) return "";
    unsigned this_len;
    char const* this_str;
    decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
    return JSONCPP_STRING(this_str, this_len);
  }
  case booleanValue:
    return value_.bool_ ? "true" : "false";
  case intValue:
    return valueToString(value_.int_);
  case uintValue:
    return valueToString(value_.uint_);
  case realValue:
    return valueToString(value_.real_);
  default:
    JSON_FAIL_MESSAGE("Type is not convertible to string");
  }
}